

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int BUFFER_pre_build(BUFFER_HANDLE handle,size_t size)

{
  LOGGER_LOG p_Var1;
  uchar *puVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  BUFFER *b;
  int result;
  size_t size_local;
  BUFFER_HANDLE handle_local;
  
  if (handle == (BUFFER_HANDLE)0x0) {
    b._4_4_ = 0x108;
  }
  else if (size == 0) {
    b._4_4_ = 0x10d;
  }
  else if (handle->buffer == (uchar *)0x0) {
    puVar2 = (uchar *)malloc(size);
    handle->buffer = puVar2;
    if (puVar2 == (uchar *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                  ,"BUFFER_pre_build",0x11d,1,"Failure allocating buffer");
      }
      b._4_4_ = 0x11e;
    }
    else {
      handle->size = size;
      b._4_4_ = 0;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                ,"BUFFER_pre_build",0x115,1,"Failure buffer data is NULL");
    }
    b._4_4_ = 0x116;
  }
  return b._4_4_;
}

Assistant:

int BUFFER_pre_build(BUFFER_HANDLE handle, size_t size)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_BUFFER_07_006: [If handle is NULL or size is 0 then BUFFER_pre_build shall return a nonzero value.] */
        result = MU_FAILURE;
    }
    else if (size == 0)
    {
        /* Codes_SRS_BUFFER_07_006: [If handle is NULL or size is 0 then BUFFER_pre_build shall return a nonzero value.] */
        result = MU_FAILURE;
    }
    else
    {
        BUFFER* b = (BUFFER*)handle;
        if (b->buffer != NULL)
        {
            /* Codes_SRS_BUFFER_07_007: [BUFFER_pre_build shall return nonzero if the buffer has been previously allocated and is not NULL.] */
            LogError("Failure buffer data is NULL");
            result = MU_FAILURE;
        }
        else
        {
            if ((b->buffer = (unsigned char*)malloc(size)) == NULL)
            {
                /* Codes_SRS_BUFFER_07_013: [BUFFER_pre_build shall return nonzero if any error is encountered.] */
                LogError("Failure allocating buffer");
                result = MU_FAILURE;
            }
            else
            {
                b->size = size;
                result = 0;
            }
        }
    }
    return result;
}